

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::get_shaderiv(NegativeTestContext *ctx)

{
  ostringstream *this;
  TestLog *pTVar1;
  GLuint shader;
  GLuint shader_00;
  char *pcVar2;
  GLboolean shaderCompilerSupported;
  GLint param [1];
  GLboolean local_1a5;
  GLint local_1a4;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_128 [264];
  
  shader = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  local_1a4 = -1;
  glu::CallLogWrapper::glGetBooleanv(&ctx->super_CallLogWrapper,0x8dfa,&local_1a5);
  local_1a0._0_8_ = (ctx->super_CallLogWrapper).m_log;
  this = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"// GL_SHADER_COMPILER = ",0x18);
  pcVar2 = "GL_TRUE";
  if (local_1a5 == '\0') {
    pcVar2 = "GL_FALSE";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,pcVar2,(ulong)(local_1a5 == '\0') + 7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_128);
  pTVar1 = (TestLog *)(local_1a0 + 0x10);
  local_1a0._0_8_ = pTVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,"GL_INVALID_ENUM is generated if pname is not an accepted value.",
             "");
  NegativeTestContext::beginSection(ctx,(string *)local_1a0);
  if ((TestLog *)local_1a0._0_8_ != pTVar1) {
    operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetShaderiv(&ctx->super_CallLogWrapper,shader,0xffffffff,&local_1a4);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_1a0._0_8_ = pTVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,
             "GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.","");
  NegativeTestContext::beginSection(ctx,(string *)local_1a0);
  if ((TestLog *)local_1a0._0_8_ != pTVar1) {
    operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetShaderiv(&ctx->super_CallLogWrapper,0xffffffff,0x8b4f,&local_1a4);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_1a0._0_8_ = pTVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,
             "GL_INVALID_OPERATION is generated if shader does not refer to a shader object.","");
  NegativeTestContext::beginSection(ctx,(string *)local_1a0);
  if ((TestLog *)local_1a0._0_8_ != pTVar1) {
    operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetShaderiv(&ctx->super_CallLogWrapper,shader_00,0x8b4f,&local_1a4);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,shader_00);
  return;
}

Assistant:

void get_shaderiv (NegativeTestContext& ctx)
{
	GLboolean	shaderCompilerSupported;
	GLuint		shader		= ctx.glCreateShader(GL_VERTEX_SHADER);
	GLuint		program		= ctx.glCreateProgram();
	GLint		param[1]	= { -1 };

	ctx.glGetBooleanv(GL_SHADER_COMPILER, &shaderCompilerSupported);
	ctx.getLog() << TestLog::Message << "// GL_SHADER_COMPILER = " << (shaderCompilerSupported ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted value.");
	ctx.glGetShaderiv(shader, -1, &param[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if shader is not a value generated by OpenGL.");
	ctx.glGetShaderiv(-1, GL_SHADER_TYPE, &param[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader does not refer to a shader object.");
	ctx.glGetShaderiv(program, GL_SHADER_TYPE, &param[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteShader(shader);
	ctx.glDeleteProgram(program);
}